

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::PixelGameEngine::pgex_Register(PixelGameEngine *this,PGEX *pgex)

{
  pointer *pppPVar1;
  iterator __position;
  __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_> _Var2;
  PGEX *local_10;
  
  local_10 = pgex;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<olc::PGEX**,std::vector<olc::PGEX*,std::allocator<olc::PGEX*>>>,__gnu_cxx::__ops::_Iter_equals_val<olc::PGEX*const>>
                    ((this->vExtensions).
                     super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->vExtensions).
                     super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<olc::PGEX*,std::allocator<olc::PGEX*>>::_M_realloc_insert<olc::PGEX*const&>
                ((vector<olc::PGEX*,std::allocator<olc::PGEX*>> *)&this->vExtensions,__position,
                 &local_10);
    }
    else {
      *__position._M_current = local_10;
      pppPVar1 = &(this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  return;
}

Assistant:

void PixelGameEngine::pgex_Register(olc::PGEX *pgex)
	{
		if (std::find(vExtensions.begin(), vExtensions.end(), pgex) == vExtensions.end())
			vExtensions.push_back(pgex);
	}